

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O1

void __thiscall acto::core::worker_t::~worker_t(worker_t *this)

{
  LOCK();
  (this->active_)._M_base._M_i = false;
  UNLOCK();
  event::signaled(&this->wakeup_event_);
  if ((this->thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->thread_)._M_id._M_thread == 0) {
    std::condition_variable::~condition_variable(&(this->wakeup_event_).cond_);
    return;
  }
  std::terminate();
}

Assistant:

worker_t::~worker_t() {
  active_ = false;
  wakeup_event_.signaled();

  if (thread_.joinable()) {
    thread_.join();
  }
}